

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O1

string * MeteomaticsApiClient::getOptionalSelectString
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *optionals)

{
  pointer pbVar1;
  pointer pbVar2;
  ulong uVar3;
  long lVar4;
  
  pbVar2 = (optionals->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (optionals->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pbVar2 == pbVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"?","");
    pbVar2 = (optionals->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((optionals->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
      lVar4 = 8;
      uVar3 = 0;
      do {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,*(ulong *)((long)pbVar2 + lVar4 + -8));
        if (uVar3 != ((long)(optionals->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(optionals->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        uVar3 = uVar3 + 1;
        pbVar2 = (optionals->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x20;
      } while (uVar3 < (ulong)((long)(optionals->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5
                              ));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MeteomaticsApiClient::getOptionalSelectString(const std::vector<std::string>& optionals)
{
    if (optionals.empty())
    {
        return "";
    }
    
    std::string ret="?";
    for (std::size_t i=0; i<optionals.size(); i++)
    {
        ret += optionals[i];
        if (i != optionals.size()-1)
        {
            ret += "&";
        }
    }
    return ret;
}